

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_print.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 local_48;
  kvtree *hash;
  char *filename;
  int print_mode;
  int numargs;
  int c;
  int long_index;
  char *mode;
  int usage;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  mode._4_4_ = 0;
  mode._0_4_ = 0;
  _c = (char *)0x0;
  numargs = 0;
  _usage = argv;
  argv_local._0_4_ = argc;
  while (print_mode = getopt_long((int)argv_local,_usage,main::opt_string,main::long_options,
                                  &numargs), print_mode != -1) {
    if (print_mode == 0x68) {
      mode._0_4_ = 1;
    }
    else if (print_mode == 0x6d) {
      _c = strdup(_optarg);
    }
    else {
      printf("ERROR: Unknown option: `%s\'\n",_usage[_optind + -1]);
      mode._0_4_ = 1;
      mode._4_4_ = 1;
    }
  }
  filename._4_4_ = (int)argv_local - _optind;
  if (((int)mode == 0) && (filename._4_4_ != 1)) {
    printf("ERROR: Missing file name or too many files\n");
    mode._0_4_ = 1;
    mode._4_4_ = 1;
  }
  filename._0_4_ = 1;
  if (_c != (char *)0x0) {
    iVar1 = strcmp(_c,"tree");
    if (iVar1 == 0) {
      filename._0_4_ = 1;
    }
    else {
      iVar1 = strcmp(_c,"keyval");
      if (iVar1 == 0) {
        filename._0_4_ = 2;
      }
      else {
        printf("ERROR: Invalid mode name: `%s\'\n",_c);
        mode._0_4_ = 1;
        mode._4_4_ = 1;
      }
    }
    free(_c);
  }
  if ((int)mode == 0) {
    hash = (kvtree *)_usage[_optind];
    local_48 = kvtree_new();
    iVar1 = kvtree_read_file(hash,local_48);
    if (iVar1 == 0) {
      kvtree_print_mode(local_48,0,filename._0_4_);
    }
    else {
      printf("ERROR: Failed to read file: `%s\'\n",hash);
      mode._4_4_ = 1;
    }
    kvtree_delete(&local_48);
    argv_local._4_4_ = mode._4_4_;
  }
  else {
    print_usage();
    argv_local._4_4_ = mode._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
  int rc = 0;

  static const char *opt_string = "m:h";
  static struct option long_options[] = {
    {"mode",    required_argument, NULL, 'm'},
    {"help",    no_argument,       NULL, 'h'},
    {NULL,      no_argument,       NULL,   0}
  };

  int usage = 0;
  char* mode = NULL;

  int long_index = 0;
  while (1) {
    int c = getopt_long(argc, argv, opt_string, long_options, &long_index);
    if (c == -1) {
      break;
    }

    switch(c) {
      case 'm':
        mode = strdup(optarg);
        break;
      case 'h':
        usage = 1;
        break;
      default:
        printf("ERROR: Unknown option: `%s'\n", argv[optind-1]);
        usage = 1;
        rc = 1;
        break;
    }
  }

  /* check that we were given exactly one filename argument */
  int numargs = argc - optind;
  if (!usage && numargs != 1) {
    printf("ERROR: Missing file name or too many files\n");
    usage = 1;
    rc = 1;
  }

  /* parse the print mode option, if one is given */
  int print_mode = KVTREE_PRINT_TREE;
  if (mode != NULL) {
    if (strcmp(mode, "tree") == 0) {
      print_mode = KVTREE_PRINT_TREE;
    } else if (strcmp(mode, "keyval") == 0) {
      print_mode = KVTREE_PRINT_KEYVAL;
    } else {
      printf("ERROR: Invalid mode name: `%s'\n", mode);
      usage = 1;
      rc = 1;
    }
    free(mode);
  }

  if (usage) {
    print_usage();
    return rc;
  }

  /* get the file name */
  char* filename = argv[optind];

  /* read in the file */
  kvtree* hash = kvtree_new();
  if (kvtree_read_file(filename, hash) == KVTREE_SUCCESS) {
    /* we read the file, now print it out */
    kvtree_print_mode(hash, 0, print_mode);
  } else {
    printf("ERROR: Failed to read file: `%s'\n", filename);
    rc = 1;
  }
  kvtree_delete(&hash);

  return rc;
}